

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param_test_tests2.cpp
# Opt level: O2

int My1_x_iutest_x_TypeConversionParamTest_TestSuiteInstantiationRegister(void)

{
  int iVar1;
  UnitTest *pUVar2;
  ParamTestSuiteInfo<TypeConversionParamTest> *this;
  allocator<char> local_69;
  string local_68;
  string local_48;
  string local_28;
  
  pUVar2 = iutest::UnitTest::instance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"TypeConversionParamTest",&local_69);
  iutest::detail::package_name_server<iuTest_TestSuitePackage>::getname_abi_cxx11_();
  this = iutest::detail::ParamTestSuiteHolder::GetTestSuitePatternHolder<TypeConversionParamTest>
                   (&pUVar2->m_param_testsuite_holder,&local_68,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"My1",(allocator<char> *)&local_68);
  iVar1 = iutest::detail::ParamTestSuiteInfo<TypeConversionParamTest>::AddTestSuiteInstantiation
                    (this,&local_48,s_My1_x_iutest_x_TypeConversionParamTest_EvalGenerator_,
                     s_My1_x_iutest_x_TypeConversionParamTest_ParamGenerator__abi_cxx11_,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/param_test_tests2.cpp"
                     ,0x30);
  std::__cxx11::string::~string((string *)&local_48);
  return iVar1;
}

Assistant:

IUTEST_P(TypeConversionParamTest, Test)
{
}